

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index.cc
# Opt level: O2

bool __thiscall S2ShapeIndexCell::Decode(S2ShapeIndexCell *this,int num_shape_ids,Decoder *decoder)

{
  uint32 uVar1;
  Decoder *decoder_00;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  S2ClippedShape *pSVar5;
  ulong uVar6;
  long lVar7;
  anon_union_8_2_2d159a09_for_S2ClippedShape_3 *paVar8;
  anon_union_8_2_2d159a09_for_S2ClippedShape_3 *paVar9;
  int iVar10;
  int num_edges;
  uint uVar11;
  uint uVar12;
  int32 num_edges_00;
  uint32 header;
  uint64 header_1;
  ostream *local_50;
  Decoder *local_48;
  uint local_3c;
  ulong local_38;
  
  if (num_shape_ids == 1) {
    pSVar5 = add_shapes(this,1);
    bVar2 = Decoder::get_varint64(decoder,&header_1);
    if (bVar2) {
      uVar6 = CONCAT44(header_1._4_4_,(uint)header_1);
      if (((uint)header_1 & 1) == 0) {
        uVar12 = (uint)header_1 >> 2 & 0xf;
        S2ClippedShape::Init(pSVar5,0,uVar12 + 2);
        *(uint *)&pSVar5->field_0x4 =
             *(uint *)&pSVar5->field_0x4 & 0xfffffffe |
             (uint)(CONCAT44(header_1._4_4_,(uint)header_1) >> 1) & 1;
        uVar6 = CONCAT44(header_1._4_4_,(uint)header_1) >> 6;
        for (lVar7 = 0; (ulong)uVar12 * 4 + 8 != lVar7; lVar7 = lVar7 + 4) {
          paVar8 = &pSVar5->field_3;
          if (5 < *(uint *)&pSVar5->field_0x4) {
            paVar8 = (anon_union_8_2_2d159a09_for_S2ClippedShape_3 *)(pSVar5->field_3).edges_;
          }
          *(int *)((long)paVar8 + lVar7) = (int)uVar6;
          uVar6 = (ulong)((int)uVar6 + 1);
        }
      }
      else {
        if (((uint)header_1 & 2) != 0) {
          num_edges_00 = (int32)(uVar6 >> 3);
          S2ClippedShape::Init(pSVar5,0,num_edges_00);
          *(uint *)&pSVar5->field_0x4 =
               *(uint *)&pSVar5->field_0x4 & 0xfffffffe | (uint)header_1 >> 2 & 1;
          bVar2 = DecodeEdges(num_edges_00,pSVar5,decoder);
          return bVar2;
        }
        pSVar5->shape_id_ = 0;
        *(uint *)&pSVar5->field_0x4 = (uint)(uVar6 >> 2) & 1 | 2;
        (pSVar5->field_3).inline_edges_._M_elems[0] = (int)(uVar6 >> 3);
      }
      return true;
    }
  }
  else {
    bVar2 = Decoder::get_varint32(decoder,&header);
    uVar1 = header;
    if (bVar2) {
      local_48 = decoder;
      if ((header & 7) == 3) {
        bVar2 = Decoder::get_varint32(decoder,&header);
        if (!bVar2) {
          return false;
        }
        uVar12 = uVar1 >> 3;
      }
      else {
        uVar12 = 1;
      }
      pSVar5 = add_shapes(this,uVar12);
      paVar8 = &pSVar5->field_3;
      local_38 = 0;
      iVar10 = 0;
      local_3c = uVar12;
      do {
        bVar2 = (uint)local_38 == uVar12;
        if (bVar2) {
          return bVar2;
        }
        if (((uint)local_38 != 0) && (bVar3 = Decoder::get_varint32(local_48,&header), !bVar3)) {
          return bVar2;
        }
        decoder_00 = local_48;
        if ((header & 1) == 0) {
          header_1._0_4_ = 0;
          bVar2 = Decoder::get_varint32(local_48,(uint32 *)&header_1);
          if (!bVar2) {
            return false;
          }
          iVar10 = ((uint)header_1 >> 4) + iVar10;
          uVar11 = (uint)header_1 & 0xf;
          S2ClippedShape::Init(pSVar5,iVar10,uVar11 + 1);
          *(uint *)&pSVar5->field_0x4 = *(uint *)&pSVar5->field_0x4 & 0xfffffffe | header >> 1 & 1;
          uVar4 = header >> 2;
          for (lVar7 = 0; (ulong)uVar11 * 4 + 4 != lVar7; lVar7 = lVar7 + 4) {
            paVar9 = paVar8;
            if (5 < *(uint *)&pSVar5->field_0x4) {
              paVar9 = (anon_union_8_2_2d159a09_for_S2ClippedShape_3 *)(pSVar5->field_3).edges_;
            }
            *(uint *)((long)paVar9 + lVar7) = uVar4;
            uVar4 = uVar4 + 1;
          }
        }
        else if ((~header & 7) == 0) {
          iVar10 = (header >> 4) + iVar10;
          pSVar5->shape_id_ = iVar10;
          *(uint32 *)&pSVar5->field_0x4 = header >> 3 & 1;
        }
        else {
          if ((header & 3) != 1) {
            S2LogMessage::S2LogMessage
                      ((S2LogMessage *)&header_1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2shape_index.cc"
                       ,0xf1,kFatal,(ostream *)&std::cerr);
            std::operator<<(local_50,"Check failed: (header & 3) == (1) ");
            abort();
          }
          bVar3 = Decoder::get_varint32(local_48,(uint32 *)&header_1);
          if (!bVar3) {
            return false;
          }
          iVar10 = iVar10 + (uint)header_1;
          num_edges = (header >> 3) + 1;
          S2ClippedShape::Init(pSVar5,iVar10,num_edges);
          *(uint *)&pSVar5->field_0x4 = *(uint *)&pSVar5->field_0x4 & 0xfffffffe | header >> 2 & 1;
          bVar3 = DecodeEdges(num_edges,pSVar5,decoder_00);
          uVar12 = local_3c;
          if (!bVar3) {
            return bVar2;
          }
        }
        local_38 = (ulong)((int)local_38 + 1);
        pSVar5 = pSVar5 + 1;
        iVar10 = iVar10 + 1;
        paVar8 = paVar8 + 2;
      } while( true );
    }
  }
  return false;
}

Assistant:

bool S2ShapeIndexCell::Decode(int num_shape_ids, Decoder* decoder) {
  // This function inverts the encodings documented above.
  if (num_shape_ids == 1) {
    // Entire S2ShapeIndex contains only one shape.
    S2ClippedShape* clipped = add_shapes(1);
    uint64 header;
    if (!decoder->get_varint64(&header)) return false;
    if ((header & 1) == 0) {
      // The cell contains a contiguous range of edges.
      int num_edges = ((header >> 2) & 15) + 2;
      clipped->Init(0 /*shape_id*/, num_edges);
      clipped->set_contains_center((header & 2) != 0);
      for (int i = 0, edge_id = header >> 6; i < num_edges; ++i) {
        clipped->set_edge(i, edge_id + i);
      }
      return true;
    }
    if ((header & 2) == 0) {
      // The cell contains a single edge.
      clipped->Init(0 /*shape_id*/, 1 /*num_edges*/);
      clipped->set_contains_center((header & 4) != 0);
      clipped->set_edge(0, header >> 3);
      return true;
    }
    // The cell contains some other combination of edges.
    int num_edges = header >> 3;
    clipped->Init(0 /*shape_id*/, num_edges);
    clipped->set_contains_center((header & 4) != 0);
    return DecodeEdges(num_edges, clipped, decoder);
  }
  // S2ShapeIndex contains more than one shape.
  uint32 header;
  if (!decoder->get_varint32(&header)) return false;
  int num_clipped = 1;
  if ((header & 7) == 3) {
    // This cell contains more than one shape.
    num_clipped = header >> 3;
    if (!decoder->get_varint32(&header)) return false;
  }
  int shape_id = 0;
  S2ClippedShape* clipped = add_shapes(num_clipped);
  for (int j = 0; j < num_clipped; ++j, ++clipped, ++shape_id) {
    if (j > 0 && !decoder->get_varint32(&header)) return false;
    if ((header & 1) == 0) {
      // The clipped shape contains a contiguous range of edges.
      uint32 shape_id_count = 0;
      if (!decoder->get_varint32(&shape_id_count)) return false;
      shape_id += shape_id_count >> 4;
      int num_edges = (shape_id_count & 15) + 1;
      clipped->Init(shape_id, num_edges);
      clipped->set_contains_center((header & 2) != 0);
      for (int i = 0, edge_id = header >> 2; i < num_edges; ++i) {
        clipped->set_edge(i, edge_id + i);
      }
    } else if ((header & 7) == 7) {
      // The clipped shape has no edges.
      shape_id += header >> 4;
      clipped->Init(shape_id, 0);
      clipped->set_contains_center((header & 8) != 0);
    } else {
      // The clipped shape contains some other combination of edges.
      S2_DCHECK_EQ(header & 3, 1);
      uint32 shape_delta;
      if (!decoder->get_varint32(&shape_delta)) return false;
      shape_id += shape_delta;
      int num_edges = (header >> 3) + 1;
      clipped->Init(shape_id, num_edges);
      clipped->set_contains_center((header & 4) != 0);
      if (!DecodeEdges(num_edges, clipped, decoder)) return false;
    }
  }
  return true;
}